

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-timer.c
# Opt level: O2

int run_test_timer_early_check(void)

{
  int iVar1;
  undefined8 uVar2;
  long lVar3;
  uv_loop_t *loop;
  char *pcVar4;
  uv_timer_t timer_handle;
  
  uVar2 = uv_default_loop();
  lVar3 = uv_now(uVar2);
  timer_early_check_expected_time = lVar3 + 10;
  uVar2 = uv_default_loop();
  iVar1 = uv_timer_init(uVar2,&timer_handle);
  if (iVar1 == 0) {
    iVar1 = uv_timer_start(&timer_handle,timer_early_check_cb,10,0);
    if (iVar1 == 0) {
      uVar2 = uv_default_loop();
      iVar1 = uv_run(uVar2,0);
      if (iVar1 == 0) {
        uv_close(&timer_handle,0);
        uVar2 = uv_default_loop();
        iVar1 = uv_run(uVar2,0);
        if (iVar1 == 0) {
          loop = (uv_loop_t *)uv_default_loop();
          close_loop(loop);
          uVar2 = uv_default_loop();
          iVar1 = uv_loop_close(uVar2);
          if (iVar1 == 0) {
            return 0;
          }
          pcVar4 = "0 == uv_loop_close(uv_default_loop())";
          uVar2 = 0x155;
        }
        else {
          pcVar4 = "0 == uv_run(uv_default_loop(), UV_RUN_DEFAULT)";
          uVar2 = 0x153;
        }
      }
      else {
        pcVar4 = "0 == uv_run(uv_default_loop(), UV_RUN_DEFAULT)";
        uVar2 = 0x150;
      }
    }
    else {
      pcVar4 = "0 == uv_timer_start(&timer_handle, timer_early_check_cb, timeout_ms, 0)";
      uVar2 = 0x14f;
    }
  }
  else {
    pcVar4 = "0 == uv_timer_init(uv_default_loop(), &timer_handle)";
    uVar2 = 0x14e;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-timer.c"
          ,uVar2,pcVar4);
  abort();
}

Assistant:

TEST_IMPL(timer_early_check) {
  uv_timer_t timer_handle;
  const uint64_t timeout_ms = 10;

  timer_early_check_expected_time = uv_now(uv_default_loop()) + timeout_ms;

  ASSERT(0 == uv_timer_init(uv_default_loop(), &timer_handle));
  ASSERT(0 == uv_timer_start(&timer_handle, timer_early_check_cb, timeout_ms, 0));
  ASSERT(0 == uv_run(uv_default_loop(), UV_RUN_DEFAULT));

  uv_close((uv_handle_t*) &timer_handle, NULL);
  ASSERT(0 == uv_run(uv_default_loop(), UV_RUN_DEFAULT));

  MAKE_VALGRIND_HAPPY();
  return 0;
}